

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtx_init.c
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    mtx_t plain;
    mtx_t plain_test = _PDCLIB_MTX_PLAIN_INIT;

    mtx_t recursive;
    mtx_t recursive_test = _PDCLIB_MTX_RECURSIVE_INIT;

    TESTCASE( mtx_init( &plain, mtx_plain ) == thrd_success );
    TESTCASE( memcmp( &plain, &plain_test, sizeof( mtx_t ) ) == 0 );

    TESTCASE( mtx_init( &recursive, mtx_recursive ) == thrd_success );
    TESTCASE( memcmp( &recursive, &recursive_test, sizeof( mtx_t ) ) == 0 );
#endif
    return TEST_RESULTS;
}